

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  bool is_clipped;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindow *in_stack_00000040;
  ImGuiWindow *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (((in_ESI != 0) &&
      ((((pIVar1->DC).NavLayerActiveMaskNext =
              (pIVar1->DC).NavLayerCurrentMask | (pIVar1->DC).NavLayerActiveMaskNext,
        pIVar2->NavId == in_ESI || ((pIVar2->NavAnyRequest & 1U) != 0)) &&
       (pIVar2->NavWindow->RootWindowForNav == pIVar1->RootWindowForNav)))) &&
     ((pIVar1 == pIVar2->NavWindow ||
      (((pIVar1->Flags | pIVar2->NavWindow->Flags) & 0x800000U) != 0)))) {
    in_stack_ffffffffffffffc0 = pIVar1;
    NavProcessItem(in_stack_00000040,bb,id);
  }
  (pIVar1->DC).LastItemId = in_ESI;
  (pIVar1->DC).LastItemRect.Min = *in_RDI;
  (pIVar1->DC).LastItemRect.Max = in_RDI[1];
  (pIVar1->DC).LastItemStatusFlags = 0;
  bVar3 = IsClippedEx((ImRect *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                      (ImGuiID)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x18,0));
  if (bVar3) {
    bVar3 = false;
  }
  else {
    bVar3 = IsMouseHoveringRect((ImVec2 *)
                                CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI
                                ,SUB41(in_ESI >> 0x18,0));
    if (bVar3) {
      (pIVar1->DC).LastItemStatusFlags = (pIVar1->DC).LastItemStatusFlags | 1;
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests unfortunately, but it is still limited to one window.
        //      it may not scale very well for windows with ten of thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick)
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = ImGuiItemStatusFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        ImGuiTestEngineHook_ItemAdd(&g, bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}